

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.hpp
# Opt level: O2

void __thiscall
backend::codegen::FunctionNotFoundError::FunctionNotFoundError
          (FunctionNotFoundError *this,string *fn_id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  *(undefined ***)this = &PTR__FunctionNotFoundError_001da200;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  std::operator+(&bStack_38,"Function not found: ",fn_id);
  std::__cxx11::string::operator=((string *)&this->what_,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

FunctionNotFoundError(std::string fn_id) : std::exception() {
    what_ = "Function not found: " + fn_id;
  }